

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeAssignment(ExpressionContext *ctx,SynAssignment *syntax)

{
  bool bVar1;
  ExprBase *pEVar2;
  ExprBase *rhs_00;
  ExprAssignment *this;
  TypeBase *type;
  ExprBase *rhs;
  ExprBase *lhs;
  SynAssignment *syntax_local;
  ExpressionContext *ctx_local;
  
  pEVar2 = AnalyzeExpression(ctx,syntax->lhs);
  rhs_00 = AnalyzeExpression(ctx,syntax->rhs);
  bVar1 = isType<TypeError>(pEVar2->type);
  if ((!bVar1) && (bVar1 = isType<TypeError>(rhs_00->type), !bVar1)) {
    pEVar2 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar2,rhs_00);
    return pEVar2;
  }
  this = ExpressionContext::get<ExprAssignment>(ctx);
  type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  ExprAssignment::ExprAssignment(this,&syntax->super_SynBase,type,pEVar2,rhs_00);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeAssignment(ExpressionContext &ctx, SynAssignment *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);
	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprAssignment>()) ExprAssignment(syntax, ctx.GetErrorType(), lhs, rhs);

	return CreateAssignment(ctx, syntax, lhs, rhs);
}